

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O2

void fill_mesh_at_initial_time
               (double *G,double *V,_func_double_double *g,_func_double_double *v,
               double *space_coordinates,uint space_nodes)

{
  ulong uVar1;
  double dVar2;
  
  for (uVar1 = 0; space_nodes != uVar1; uVar1 = uVar1 + 1) {
    dVar2 = (*g)(space_coordinates[uVar1]);
    G[uVar1] = dVar2;
    dVar2 = (*v)(space_coordinates[uVar1]);
    V[uVar1] = dVar2;
  }
  return;
}

Assistant:

void fill_mesh_at_initial_time (
    double * G,
    double * V,
    double (*g) (double), // log (ro_0)
    double (*v) (double), // u_0
    double const * space_coordinates,
    unsigned space_nodes) {
  register unsigned space_step = 0;
  for (space_step = 0; space_step < space_nodes; ++space_step) {
    G[space_step] = g(space_coordinates[space_step]);
    V[space_step] = v(space_coordinates[space_step]);
  }
  return;
}